

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacency.cpp
# Opt level: O1

void __thiscall glcts::AdjacencyTestData::AdjacencyTestData(AdjacencyTestData *this)

{
  this->_vptr_AdjacencyTestData = (_func_int **)&PTR__AdjacencyTestData_0215b520;
  this->m_vertex_data = (GLfloat *)0x0;
  this->m_gs_code = (char *)0x0;
  this->m_mode = 0;
  this->m_n_vertices = 0;
  this->m_grid = (AdjacencyGrid *)0x0;
  this->m_geometry_bo_size = 0;
  this->m_index_data_bo_size = 0;
  this->m_vertex_data_bo_size = 0;
  this->m_expected_adjacency_geometry = (GLfloat *)0x0;
  this->m_expected_geometry = (GLfloat *)0x0;
  *(undefined8 *)((long)&this->m_expected_geometry + 4) = 0;
  *(undefined8 *)((long)&this->m_index_data + 4) = 0;
  return;
}

Assistant:

AdjacencyTestData::AdjacencyTestData()
	: m_gs_code(0)
	, m_mode(0)
	, m_n_vertices(0)
	, m_grid(0)
	, m_geometry_bo_size(0)
	, m_index_data_bo_size(0)
	, m_vertex_data_bo_size(0)
	, m_expected_adjacency_geometry(0)
	, m_expected_geometry(0)
	, m_index_data(0)
	, m_tf_mode(0)
	, m_vertex_data(0)
{
	/* Nothing to be done here */
}